

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_test.cc
# Opt level: O2

void intgemm::kernel_write_test<(intgemm::CPUType)3,double>(void)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  AlignedVector<double> output;
  AlignedVector<double> input;
  double local_d0;
  SourceLineInfo local_c8;
  StringRef local_b8;
  BinaryExpr<const_double_&,_const_double_&> local_a8;
  AssertionHandler catchAssertionHandler;
  
  if (2 < kCPU) {
    AlignedVector<double>::AlignedVector(&input,4,0x40);
    AlignedVector<double>::AlignedVector(&output,4,0x40);
    dVar5 = 0.0;
    for (lVar3 = 0; input.size_ << 3 != lVar3; lVar3 = lVar3 + 8) {
      *(double *)((long)input.mem_ + lVar3) = dVar5;
      dVar5 = dVar5 + 1.0;
    }
    dVar5 = input.mem_[1];
    dVar1 = input.mem_[2];
    dVar2 = input.mem_[3];
    *output.mem_ = *input.mem_;
    output.mem_[1] = dVar5;
    output.mem_[2] = dVar1;
    output.mem_[3] = dVar2;
    lVar4 = 0;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      local_a8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x18fab9;
      local_a8.super_ITransientExpression.m_isBinaryExpression = true;
      local_a8.super_ITransientExpression.m_result = false;
      local_a8.super_ITransientExpression._10_6_ = 0;
      local_c8.file =
           "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/write_test.cc"
      ;
      local_c8.line = 0x1c;
      Catch::StringRef::StringRef(&local_b8,"output[i] == ElemType_(i)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_a8,&local_c8,local_b8,ContinueOnFailure)
      ;
      local_c8.file = (char *)((long)output.mem_ + lVar4);
      local_d0 = (double)lVar3;
      Catch::ExprLhs<double_const&>::operator==
                (&local_a8,(ExprLhs<double_const&> *)&local_c8,&local_d0);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,&local_a8.super_ITransientExpression);
      Catch::ITransientExpression::~ITransientExpression(&local_a8.super_ITransientExpression);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      lVar4 = lVar4 + 8;
    }
    free(output.mem_);
    free(input.mem_);
  }
  return;
}

Assistant:

void kernel_write_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr static std::size_t VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(0));

  kernels::write(*input.template as<vec_t>(), output.begin(), 0);
  for (std::size_t i = 0; i < VECTOR_LENGTH; ++i)
#if !defined( __EXCEPTIONS) && defined(__GNUC__) && (__GNUC__ == 9) && ((__GNUC_MINOR__ == 3) || (__GNUC_MINOR__ == 4))
    CHECK(output[i] == input[i]); // GCC 9.3 - exceptions breaks std::iota with newer check.
#else
    CHECK(output[i] == ElemType_(i));
#endif
}